

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O1

bool __thiscall ON_PolylineCurve::Reverse(ON_PolylineCurve *this)

{
  double dVar1;
  double *pdVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar4 = ON_Polyline::PointCount(&this->m_pline);
  if (1 < (int)uVar4) {
    ON_SimpleArray<ON_3dPoint>::Reverse((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
    lVar5 = (long)(this->m_t).m_count;
    if (1 < lVar5) {
      pdVar2 = (this->m_t).m_a;
      lVar7 = 0;
      lVar5 = lVar5 + -2;
      do {
        dVar1 = pdVar2[lVar7];
        pdVar2[lVar7] = pdVar2[lVar5 + 1];
        pdVar2[lVar5 + 1] = dVar1;
        lVar7 = lVar7 + 1;
        bVar3 = lVar7 < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar3);
    }
    pdVar2 = (this->m_t).m_a;
    uVar6 = 1;
    if (1 < (int)uVar4) {
      uVar6 = (ulong)uVar4;
    }
    uVar8 = 0;
    do {
      pdVar2[uVar8] = -pdVar2[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return 1 < (int)uVar4;
}

Assistant:

bool
ON_PolylineCurve::Reverse()
{
  bool rc = false;
  const int count = PointCount();
  if ( count >= 2 ) {
    m_pline.Reverse();
    m_t.Reverse();
    double* t = m_t.Array();
    for ( int i = 0; i < count; i++ ) {
      t[i] = -t[i];
    }
    rc = true;
  }
	DestroyCurveTree();
  return rc;
}